

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::clear(FieldMap *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  FieldMap **group;
  _Base_ptr p_Var3;
  
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::clear(&this->m_fields);
  for (p_Var2 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_left;
    for (p_Var3 = p_Var2[1]._M_parent; p_Var3 != p_Var1; p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
      if (*(long **)p_Var3 != (long *)0x0) {
        (**(code **)(**(long **)p_Var3 + 8))();
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::clear(&(this->m_groups)._M_t);
  return;
}

Assistant:

void FieldMap::clear() {
  m_fields.clear();

  for (auto const &tagWithGroups : m_groups) {
    for (auto const &group : tagWithGroups.second) {
      delete group;
    }
  }

  m_groups.clear();
}